

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmMakefile *pcVar1;
  _List_node_base *p_Var2;
  iterator iVar3;
  iterator iVar4;
  bool bVar5;
  int iVar6;
  cmState *this_00;
  cmCommand *pcVar7;
  cmTarget *pcVar8;
  cmTest *pcVar9;
  ostream *poVar10;
  char *pcVar11;
  ulong uVar12;
  PolicyID id;
  cmConditionEvaluator *pcVar13;
  cmMakefile *pcVar14;
  cmExpandedCommandArgument *pcVar15;
  string *name;
  int reducible;
  iterator argP1;
  iterator arg;
  iterator argP2;
  PolicyID pid;
  int local_234;
  iterator local_230;
  iterator local_228;
  iterator local_220;
  _List_node_base *local_218;
  string local_210;
  string local_1f0;
  ulong local_1d0;
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  pointer local_50 [2];
  _Alloc_hider local_40;
  
  pcVar1 = (cmMakefile *)(local_1c8 + 0x10);
  local_218 = (_List_node_base *)newArgs;
  do {
    local_234 = 0;
    local_228._M_node =
         (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
          &((_List_node_base *)newArgs)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    local_220._M_node = (_List_node_base *)0x0;
    if (local_228._M_node != (_List_node_base *)newArgs) {
      do {
        local_230._M_node = local_228._M_node;
        if ((local_228._M_node != (_List_node_base *)newArgs) &&
           (local_230._M_node =
                 (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    *)&(local_228._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next
           , local_220._M_node = local_230._M_node, local_230._M_node != (_List_node_base *)newArgs)
           ) {
          local_220._M_node =
               (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&(local_230._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"EXISTS","");
        pcVar15 = (cmExpandedCommandArgument *)(local_228._M_node + 1);
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != (_List_node_base *)newArgs) {
            pcVar13 = (cmConditionEvaluator *)iVar3._M_node[1]._M_next;
            bVar5 = cmsys::SystemTools::FileExists((char *)pcVar13);
            HandlePredicate(pcVar13,bVar5,&local_234,&local_228,newArgs,&local_230,&local_220);
          }
        }
        else if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"IS_DIRECTORY","");
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != (_List_node_base *)newArgs) {
            std::__cxx11::string::string
                      ((string *)local_1c8,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_210)
            ;
            pcVar13 = (cmConditionEvaluator *)local_1c8;
            bVar5 = cmsys::SystemTools::FileIsDirectory((string *)local_1c8);
            HandlePredicate(pcVar13,bVar5,&local_234,&local_228,newArgs,&local_230,&local_220);
            goto LAB_002abb30;
          }
        }
        else {
LAB_002abb30:
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"IS_SYMLINK","");
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != (_List_node_base *)newArgs) {
            std::__cxx11::string::string
                      ((string *)local_1c8,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_210)
            ;
            pcVar13 = (cmConditionEvaluator *)local_1c8;
            bVar5 = cmsys::SystemTools::FileIsSymlink((string *)local_1c8);
            HandlePredicate(pcVar13,bVar5,&local_234,&local_228,newArgs,&local_230,&local_220);
            goto LAB_002abbe0;
          }
        }
        else {
LAB_002abbe0:
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"IS_ABSOLUTE","");
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != (_List_node_base *)newArgs) {
            pcVar13 = (cmConditionEvaluator *)iVar3._M_node[1]._M_next;
            bVar5 = cmsys::SystemTools::FileIsFullPath((char *)pcVar13);
            HandlePredicate(pcVar13,bVar5,&local_234,&local_228,newArgs,&local_230,&local_220);
          }
        }
        else if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"COMMAND","");
        pcVar15 = (cmExpandedCommandArgument *)(local_228._M_node + 1);
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != (_List_node_base *)newArgs) {
            this_00 = cmMakefile::GetState(this->Makefile);
            std::__cxx11::string::string
                      ((string *)local_1c8,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_210)
            ;
            pcVar7 = cmState::GetCommand(this_00,(string *)local_1c8);
            pcVar14 = (cmMakefile *)local_1c8._0_8_;
            if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            newArgs = (cmArgumentList *)local_218;
            HandlePredicate((cmConditionEvaluator *)pcVar14,pcVar7 != (cmCommand *)0x0,&local_234,
                            &local_228,(cmArgumentList *)local_218,&local_230,&local_220);
          }
        }
        else if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"POLICY","");
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != (_List_node_base *)newArgs) {
            pcVar13 = (cmConditionEvaluator *)iVar3._M_node[1]._M_next;
            bVar5 = cmPolicies::GetPolicyID((char *)pcVar13,(PolicyID *)local_1c8);
            HandlePredicate(pcVar13,bVar5,&local_234,&local_228,newArgs,&local_230,&local_220);
          }
        }
        else if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"TARGET","");
        bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if (iVar3._M_node != local_218) {
            pcVar14 = this->Makefile;
            pcVar8 = cmMakefile::FindTargetToUse(pcVar14,(string *)(iVar3._M_node + 1),false);
            HandlePredicate((cmConditionEvaluator *)pcVar14,pcVar8 != (cmTarget *)0x0,&local_234,
                            &local_228,(cmArgumentList *)local_218,&local_230,&local_220);
          }
        }
        else if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if (this->Policy64Status < NEW) {
          if (this->Policy64Status == WARN) {
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"TEST","");
            bVar5 = IsKeyword(this,&local_1f0,pcVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar5 = false;
          }
          if (bVar5 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_210,(cmPolicies *)0x40,id);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1c8,local_210._M_dataplus._M_p,
                                 local_210._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,
                       "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x82);
            pcVar14 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar14,AUTHOR_WARNING,&local_210,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
          }
        }
        else {
          local_1c8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"TEST","");
          bVar5 = IsKeyword(this,(string *)local_1c8,pcVar15);
          iVar3._M_node = local_230._M_node;
          if (bVar5) {
            if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
              operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            }
            if (iVar3._M_node != local_218) {
              pcVar14 = this->Makefile;
              std::__cxx11::string::string
                        ((string *)local_1c8,(char *)iVar3._M_node[1]._M_next,
                         (allocator *)&local_210);
              pcVar9 = cmMakefile::GetTest(pcVar14,(string *)local_1c8);
              p_Var2 = local_218;
              pcVar14 = (cmMakefile *)local_1c8._0_8_;
              if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
                operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
              }
              HandlePredicate((cmConditionEvaluator *)pcVar14,pcVar9 != (cmTest *)0x0,&local_234,
                              &local_228,(cmArgumentList *)p_Var2,&local_230,&local_220);
            }
          }
          else if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
        }
        local_1c8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"DEFINED","");
        iVar4._M_node = local_228._M_node;
        bVar5 = IsKeyword(this,(string *)local_1c8,
                          (cmExpandedCommandArgument *)(local_228._M_node + 1));
        iVar3._M_node = local_230._M_node;
        if (bVar5) {
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          newArgs = (cmArgumentList *)local_218;
          if (iVar3._M_node != local_218) {
            p_Var2 = iVar3._M_node[1]._M_prev;
            name = (string *)(iVar3._M_node + 1);
            if (p_Var2 < (_List_node_base *)0x5) {
              uVar12 = 0;
            }
            else {
              std::__cxx11::string::substr((ulong)local_50,(ulong)name);
              iVar6 = std::__cxx11::string::compare((char *)local_50);
              uVar12 = 0;
              if (iVar6 == 0) {
                uVar12 = (ulong)(((name->_M_dataplus)._M_p + -1)[(long)p_Var2] == '}');
              }
            }
            if (((_List_node_base *)0x4 < p_Var2) && (local_50[0] != (pointer)&local_40)) {
              local_1d0 = uVar12;
              operator_delete(local_50[0],(ulong)(local_40._M_p + 1));
              uVar12 = local_1d0;
            }
            if ((char)uVar12 == '\0') {
              pcVar14 = this->Makefile;
              bVar5 = cmMakefile::IsDefinitionSet(pcVar14,name);
              newArgs = (cmArgumentList *)local_218;
            }
            else {
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)name);
              pcVar11 = cmsys::SystemTools::GetEnv((char *)local_1c8._0_8_);
              newArgs = (cmArgumentList *)local_218;
              bVar5 = pcVar11 != (char *)0x0;
              pcVar14 = (cmMakefile *)local_1c8._0_8_;
              if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
                operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
              }
            }
            HandlePredicate((cmConditionEvaluator *)pcVar14,bVar5,&local_234,&local_228,newArgs,
                            &local_230,&local_220);
          }
        }
        else {
          newArgs = (cmArgumentList *)local_218;
          if ((cmMakefile *)local_1c8._0_8_ != pcVar1) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
            newArgs = (cmArgumentList *)local_218;
          }
        }
        local_228._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(iVar4._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (local_228._M_node != (_List_node_base *)newArgs);
    }
    if (local_234 == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1 != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a test exist
      if(this->Policy64Status != cmPolicies::OLD &&
        this->Policy64Status != cmPolicies::WARN)
        {
        if (this->IsKeyword("TEST", *arg) && argP1 != newArgs.end())
          {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(
            haveTest?true:false,
            reducible, arg, newArgs, argP1, argP2);
          }
        }
      else if(this->Policy64Status == cmPolicies::WARN &&
        this->IsKeyword("TEST", *arg))
        {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
          "when the policy is set to NEW.  "
          "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1 != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}